

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

bool __thiscall CScript::HasValidOps(CScript *this)

{
  const_iterator x;
  bool bVar1;
  size_type sVar2;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> item;
  opcodetype opcode;
  const_iterator it;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff78;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vchRet;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffac;
  byte local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  uint local_14;
  uchar *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (uchar *)prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                                (in_stack_ffffffffffffff80);
  while( true ) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_ffffffffffffff80);
    x.ptr._7_1_ = in_stack_ffffffffffffff8f;
    x.ptr._0_7_ = in_stack_ffffffffffffff88;
    bVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator<
                      ((const_iterator *)in_stack_ffffffffffffff80,x);
    if (!bVar1) break;
    vchRet = &local_30;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff9f =
         GetOp((CScript *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDI,
               (opcodetype *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),vchRet);
    if ((((bool)in_stack_ffffffffffffff9f) && (local_14 < 0xba)) &&
       (sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          (in_stack_ffffffffffffff78), sVar2 < 0x209)) {
      iVar3 = 0;
    }
    else {
      local_31 = 0;
      iVar3 = 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    if (iVar3 != 0) goto LAB_00221a25;
    in_stack_ffffffffffffffa8 = 0;
  }
  local_31 = 1;
LAB_00221a25:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool CScript::HasValidOps() const
{
    CScript::const_iterator it = begin();
    while (it < end()) {
        opcodetype opcode;
        std::vector<unsigned char> item;
        if (!GetOp(it, opcode, item) || opcode > MAX_OPCODE || item.size() > MAX_SCRIPT_ELEMENT_SIZE) {
            return false;
        }
    }
    return true;
}